

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

CrtAllocator * __thiscall
rapidjson::internal::Stack<rapidjson::CrtAllocator>::GetAllocator
          (Stack<rapidjson::CrtAllocator> *this)

{
  RapidJSONException *this_00;
  Stack<rapidjson::CrtAllocator> *this_local;
  
  if (this->allocator_ == (CrtAllocator *)0x0) {
    this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this_00,"rapidjson internal assertion failure: allocator_");
    __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,
                cereal::RapidJSONException::~RapidJSONException);
  }
  return this->allocator_;
}

Assistant:

Allocator& GetAllocator() {
        CEREAL_RAPIDJSON_ASSERT(allocator_);
        return *allocator_;
    }